

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O0

bool __thiscall
google::protobuf::MessageLite::SerializePartialToZeroCopyStream
          (MessageLite *this,ZeroCopyOutputStream *output)

{
  size_t stream_00;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  LogMessage *pLVar3;
  undefined4 extraout_var_00;
  string_view v;
  undefined1 local_b0 [8];
  EpsCopyOutputStream stream;
  uint8_t *target;
  LogMessage local_40;
  Voidify local_29;
  ulong local_28;
  size_t size;
  ZeroCopyOutputStream *output_local;
  MessageLite *this_local;
  
  size = (size_t)output;
  output_local = (ZeroCopyOutputStream *)this;
  iVar2 = (*this->_vptr_MessageLite[3])();
  stream_00 = size;
  local_28 = CONCAT44(extraout_var,iVar2);
  if (local_28 < 0x80000000) {
    bVar1 = io::CodedOutputStream::IsDefaultSerializationDeterministic();
    io::EpsCopyOutputStream::EpsCopyOutputStream
              ((EpsCopyOutputStream *)local_b0,(ZeroCopyOutputStream *)stream_00,bVar1,
               (uint8_t **)&stream.had_error_);
    iVar2 = (*this->_vptr_MessageLite[5])(this,stream._56_8_,local_b0);
    stream._56_8_ = CONCAT44(extraout_var_00,iVar2);
    io::EpsCopyOutputStream::Trim((EpsCopyOutputStream *)local_b0,(uint8_t *)stream._56_8_);
    bVar1 = io::EpsCopyOutputStream::HadError((EpsCopyOutputStream *)local_b0);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    absl::lts_20250127::log_internal::LogMessage::LogMessage
              (&local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message_lite.cc"
               ,0x220);
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_40);
    v = GetTypeName(this);
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar3,v);
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar3,(char (*) [41])" exceeded maximum protobuf size of 2GB: ");
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar3,local_28);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_29,pLVar3);
    absl::lts_20250127::log_internal::LogMessage::~LogMessage(&local_40);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool MessageLite::SerializePartialToZeroCopyStream(
    io::ZeroCopyOutputStream* output) const {
  const size_t size = ByteSizeLong();  // Force size to be cached.
  if (size > INT_MAX) {
    ABSL_LOG(ERROR) << GetTypeName()
                    << " exceeded maximum protobuf size of 2GB: " << size;
    return false;
  }

  uint8_t* target;
  io::EpsCopyOutputStream stream(
      output, io::CodedOutputStream::IsDefaultSerializationDeterministic(),
      &target);
  target = _InternalSerialize(target, &stream);
  stream.Trim(target);
  if (stream.HadError()) return false;
  return true;
}